

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O3

char nsvg__parseLineJoin(char *str)

{
  char cVar1;
  int iVar2;
  
  iVar2 = strcmp(str,"miter");
  if (iVar2 == 0) {
    cVar1 = '\0';
  }
  else {
    iVar2 = strcmp(str,"round");
    if (iVar2 == 0) {
      cVar1 = '\x01';
    }
    else {
      iVar2 = strcmp(str,"bevel");
      cVar1 = (iVar2 == 0) * '\x02';
    }
  }
  return cVar1;
}

Assistant:

static char nsvg__parseLineJoin(const char* str)
{
	if (strcmp(str, "miter") == 0)
		return NSVG_JOIN_MITER;
	else if (strcmp(str, "round") == 0)
		return NSVG_JOIN_ROUND;
	else if (strcmp(str, "bevel") == 0)
		return NSVG_JOIN_BEVEL;
	// TODO: handle inherit.
	return NSVG_CAP_BUTT;
}